

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict helper_bitrev_mipsel(target_ulong_conflict rt)

{
  undefined4 local_18;
  undefined4 local_14;
  int i;
  uint32_t rd;
  int32_t temp;
  target_ulong_conflict rt_local;
  
  i = rt & 0xffff;
  local_14 = 0;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    local_14 = local_14 << 1 | i & 1U;
    i = i >> 1;
  }
  return local_14;
}

Assistant:

target_ulong helper_bitrev(target_ulong rt)
{
    int32_t temp;
    uint32_t rd;
    int i;

    temp = rt & MIPSDSP_LO;
    rd = 0;
    for (i = 0; i < 16; i++) {
        rd = (rd << 1) | (temp & 1);
        temp = temp >> 1;
    }

    return (target_ulong)rd;
}